

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall pbrt::MaterialHandle::ToString_abi_cxx11_(MaterialHandle *this)

{
  void *pvVar1;
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  anon_class_1_0_00000001 toStr;
  allocator<char> local_11;
  allocator<char> *__a;
  string *__s;
  
  __a = in_RSI;
  __s = in_RDI;
  pvVar1 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           ::ptr((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                  *)in_RSI);
  if (pvVar1 == (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,__a);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    TaggedPointer<pbrt::CoatedDiffuseMaterial,pbrt::CoatedConductorMaterial,pbrt::ConductorMaterial,pbrt::DielectricMaterial,pbrt::DiffuseMaterial,pbrt::DiffuseTransmissionMaterial,pbrt::HairMaterial,pbrt::MeasuredMaterial,pbrt::SubsurfaceMaterial,pbrt::ThinDielectricMaterial,pbrt::MixMaterial>
    ::DispatchCPU<pbrt::MaterialHandle::ToString[abi:cxx11]()const::__0>
              ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string MaterialHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto toStr = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(toStr);
}